

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_panel.cxx
# Opt level: O2

void type_make_cb(Fl_Widget *param_1,void *d)

{
  Fl_Type *o;
  
  undo_checkpoint();
  o = Fl_Type_make((char *)d);
  if (o != (Fl_Type *)0x0) {
    select_only(o);
    set_modflag(1);
    (*o->_vptr_Fl_Type[0xb])(o);
    return;
  }
  undo_current = undo_current + -1;
  undo_last = undo_last + -1;
  return;
}

Assistant:

void type_make_cb(Fl_Widget*,void*d) {
  undo_checkpoint();
    Fl_Type *t = Fl_Type_make((char*)d);
    if (t) {
      select_only(t);
      set_modflag(1);
      t->open();
    } else {
      undo_current --;
      undo_last --;
    }
}